

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::scrollTo(QTableView *this,QModelIndex *index,ScrollHint hint)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ScrollMode SVar5;
  int iVar6;
  int visualIndex;
  QTableViewPrivate *pQVar7;
  int in_EDX;
  QModelIndex *in_RSI;
  long in_FS_OFFSET;
  int row_1;
  int s_1;
  int hiddenSections_1;
  int row;
  int y;
  int h;
  int cellHeight;
  int verticalIndex;
  int verticalPosition;
  int verticalOffset;
  int viewportHeight;
  int column;
  int s;
  int hiddenSections;
  int x;
  int w;
  bool positionAtRight;
  bool positionAtLeft;
  int cellWidth;
  int horizontalIndex;
  int horizontalPosition;
  int horizontalOffset;
  int viewportWidth;
  QTableViewPrivate *d;
  Span span;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  QModelIndex *in_stack_fffffffffffffec8;
  QTableViewPrivate *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  QHeaderView *in_stack_fffffffffffffee8;
  QHeaderView *this_00;
  int local_10c;
  int local_f4;
  bool local_c1;
  int local_bc;
  int local_b0;
  int local_a4;
  int local_90;
  int local_88;
  int local_78;
  int local_5c;
  undefined1 local_48 [24];
  undefined1 *local_30;
  undefined1 *local_28;
  bool local_20;
  undefined1 *local_1c;
  undefined1 *local_14;
  undefined4 local_c;
  long local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QTableView *)0x8beb95);
  bVar2 = QAbstractItemViewPrivate::isIndexValid
                    (&in_stack_fffffffffffffed0->super_QAbstractItemViewPrivate,
                     in_stack_fffffffffffffec8);
  local_c1 = true;
  if (bVar2) {
    pQVar1 = (pQVar7->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0x68))(local_48,pQVar1,in_RSI);
    bVar2 = ::operator!=((QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         (QPersistentModelIndex *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_c1 = true;
    if (!bVar2) {
      QModelIndex::row(in_RSI);
      bVar2 = isRowHidden((QTableView *)
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      local_c1 = true;
      if (!bVar2) {
        QModelIndex::column(in_RSI);
        local_c1 = isColumnHidden((QTableView *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  in_stack_fffffffffffffebc);
      }
    }
  }
  if (local_c1 == false) {
    local_1c = &DAT_aaaaaaaaaaaaaaaa;
    local_14 = &DAT_aaaaaaaaaaaaaaaa;
    local_c._0_1_ = true;
    local_c._1_3_ = 0xaaaaaa;
    QSpanCollection::Span::Span((Span *)&local_1c);
    bVar2 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8becb8);
    if (bVar2) {
      QModelIndex::row(in_RSI);
      QModelIndex::column(in_RSI);
      QTableViewPrivate::span
                (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (int)in_stack_fffffffffffffec8);
      local_1c = local_30;
      local_14 = local_28;
      local_c._0_1_ = local_20;
    }
    local_10c = QWidget::width((QWidget *)0x8bed43);
    iVar3 = QHeaderView::offset((QHeaderView *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    QModelIndex::column(in_RSI);
    iVar4 = QHeaderView::sectionPosition
                      ((QHeaderView *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    QModelIndex::column(in_RSI);
    local_78 = QHeaderView::visualIndex(in_stack_fffffffffffffee8,iVar6);
    bVar2 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8bedda);
    if (bVar2) {
      QModelIndex::column(in_RSI);
      QSpanCollection::Span::width((Span *)&local_1c);
      local_f4 = QTableViewPrivate::columnSpanWidth
                           ((QTableViewPrivate *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    }
    else {
      QModelIndex::column(in_RSI);
      local_f4 = QHeaderView::sectionSize
                           ((QHeaderView *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    }
    SVar5 = QAbstractItemView::horizontalScrollMode
                      ((QAbstractItemView *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (SVar5 == ScrollPerItem) {
      bVar2 = local_10c < (iVar4 - iVar3) + local_f4;
      if ((in_EDX == 3) || (bVar2)) {
        if (in_EDX == 3) {
          local_10c = local_10c / 2;
        }
        local_88 = local_f4;
        for (; 0 < local_78; local_78 = local_78 + -1) {
          QHeaderView::logicalIndex
                    ((QHeaderView *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
          iVar6 = columnWidth((QTableView *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              in_stack_fffffffffffffebc);
          local_88 = iVar6 + local_88;
          if (local_10c < local_88) break;
        }
      }
      if (((bVar2) || (in_EDX == 3)) || (iVar4 - iVar3 < 0)) {
        bVar2 = QHeaderView::sectionsHidden
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        if (bVar2) {
          while (local_90 = local_78 + -1, -1 < local_90) {
            QHeaderView::logicalIndex
                      ((QHeaderView *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
            QHeaderView::isSectionHidden
                      ((QHeaderView *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
            local_78 = local_90;
          }
        }
        QAbstractScrollArea::horizontalScrollBar
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      }
    }
    else if (in_EDX == 3) {
      QAbstractScrollArea::horizontalScrollBar
                ((QAbstractScrollArea *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      QAbstractSlider::setValue
                ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    }
    else if ((iVar4 - iVar3 < 0) || (local_10c < local_f4)) {
      QAbstractScrollArea::horizontalScrollBar
                ((QAbstractScrollArea *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      QAbstractSlider::setValue
                ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    }
    else if (local_10c < (iVar4 - iVar3) + local_f4) {
      QAbstractScrollArea::horizontalScrollBar
                ((QAbstractScrollArea *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      QAbstractSlider::setValue
                ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    }
    visualIndex = QWidget::height((QWidget *)0x8bf14b);
    iVar3 = QHeaderView::offset((QHeaderView *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    iVar6 = (int)((ulong)pQVar7->verticalHeader >> 0x20);
    QModelIndex::row(in_RSI);
    iVar4 = QHeaderView::sectionPosition
                      ((QHeaderView *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    this_00 = pQVar7->verticalHeader;
    QModelIndex::row(in_RSI);
    local_a4 = QHeaderView::visualIndex(this_00,iVar6);
    bVar2 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8bf1e2);
    if (bVar2) {
      in_stack_fffffffffffffed8 = QModelIndex::row(in_RSI);
      QSpanCollection::Span::height((Span *)&local_1c);
      local_b0 = QTableViewPrivate::rowSpanHeight
                           ((QTableViewPrivate *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    }
    else {
      in_stack_fffffffffffffec8 = (QModelIndex *)pQVar7->verticalHeader;
      QModelIndex::row(in_RSI);
      local_b0 = QHeaderView::sectionSize
                           ((QHeaderView *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      pQVar7 = in_stack_fffffffffffffed0;
    }
    local_5c = in_EDX;
    if ((iVar4 - iVar3 < 0) || (visualIndex < local_b0)) {
      if (in_EDX == 0) {
        local_5c = 1;
      }
    }
    else if ((visualIndex < (iVar4 - iVar3) + local_b0) && (in_EDX == 0)) {
      local_5c = 2;
    }
    iVar6 = local_b0;
    SVar5 = QAbstractItemView::verticalScrollMode
                      ((QAbstractItemView *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    iVar3 = (int)((ulong)pQVar7 >> 0x20);
    if (SVar5 == ScrollPerItem) {
      if ((local_5c == 2) || (local_5c == 3)) {
        iVar3 = visualIndex;
        if (local_5c == 3) {
          visualIndex = visualIndex / 2;
          iVar3 = visualIndex;
        }
        for (; in_stack_fffffffffffffec4 = visualIndex, 0 < local_a4; local_a4 = local_a4 + -1) {
          QHeaderView::logicalIndex((QHeaderView *)in_stack_fffffffffffffec8,visualIndex);
          iVar4 = QHeaderView::sectionSize
                            ((QHeaderView *)CONCAT44(iVar6,in_stack_fffffffffffffed8),
                             (int)((ulong)pQVar7 >> 0x20));
          local_b0 = iVar4 + local_b0;
          in_stack_fffffffffffffec4 = visualIndex;
          if (iVar3 < local_b0) break;
        }
      }
      if (((local_5c == 2) || (local_5c == 3)) || (local_5c == 1)) {
        bVar2 = QHeaderView::sectionsHidden
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        iVar3 = (int)((ulong)pQVar7 >> 0x20);
        if (bVar2) {
          while( true ) {
            iVar3 = (int)((ulong)pQVar7 >> 0x20);
            local_bc = local_a4 + -1;
            if (local_bc < 0) break;
            QHeaderView::logicalIndex
                      ((QHeaderView *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
            QHeaderView::isSectionHidden
                      ((QHeaderView *)CONCAT44(iVar6,in_stack_fffffffffffffed8),
                       (int)((ulong)pQVar7 >> 0x20));
            local_a4 = local_bc;
          }
        }
        QAbstractScrollArea::verticalScrollBar
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(iVar6,in_stack_fffffffffffffed8),iVar3);
      }
    }
    else if (local_5c == 1) {
      QAbstractScrollArea::verticalScrollBar
                ((QAbstractScrollArea *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      QAbstractSlider::setValue((QAbstractSlider *)CONCAT44(iVar6,in_stack_fffffffffffffed8),iVar3);
    }
    else if (local_5c == 2) {
      QAbstractScrollArea::verticalScrollBar
                ((QAbstractScrollArea *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      QAbstractSlider::setValue((QAbstractSlider *)CONCAT44(iVar6,in_stack_fffffffffffffed8),iVar3);
    }
    else if (local_5c == 3) {
      QAbstractScrollArea::verticalScrollBar
                ((QAbstractScrollArea *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      QAbstractSlider::setValue((QAbstractSlider *)CONCAT44(iVar6,in_stack_fffffffffffffed8),iVar3);
    }
    QAbstractItemView::update
              ((QAbstractItemView *)in_stack_fffffffffffffec8,
               (QModelIndex *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QTableView);

    // check if we really need to do anything
    if (!d->isIndexValid(index)
        || (d->model->parent(index) != d->root)
        || isRowHidden(index.row()) || isColumnHidden(index.column()))
        return;

    QSpanCollection::Span span;
    if (d->hasSpans())
        span = d->span(index.row(), index.column());

    // Adjust horizontal position

    int viewportWidth = d->viewport->width();
    int horizontalOffset = d->horizontalHeader->offset();
    int horizontalPosition = d->horizontalHeader->sectionPosition(index.column());
    int horizontalIndex = d->horizontalHeader->visualIndex(index.column());
    int cellWidth = d->hasSpans()
                    ? d->columnSpanWidth(index.column(), span.width())
                    : d->horizontalHeader->sectionSize(index.column());

    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {

        bool positionAtLeft = (horizontalPosition - horizontalOffset < 0);
        bool positionAtRight = (horizontalPosition - horizontalOffset + cellWidth > viewportWidth);

        if (hint == PositionAtCenter || positionAtRight) {
            int w = (hint == PositionAtCenter ? viewportWidth / 2 : viewportWidth);
            int x = cellWidth;
            while (horizontalIndex > 0) {
                x += columnWidth(d->horizontalHeader->logicalIndex(horizontalIndex-1));
                if (x > w)
                    break;
                --horizontalIndex;
            }
        }

        if (positionAtRight || hint == PositionAtCenter || positionAtLeft) {
            int hiddenSections = 0;
            if (d->horizontalHeader->sectionsHidden()) {
                for (int s = horizontalIndex - 1; s >= 0; --s) {
                    int column = d->horizontalHeader->logicalIndex(s);
                    if (d->horizontalHeader->isSectionHidden(column))
                        ++hiddenSections;
                }
            }
            horizontalScrollBar()->setValue(horizontalIndex - hiddenSections);
        }

    } else { // ScrollPerPixel
        if (hint == PositionAtCenter) {
            horizontalScrollBar()->setValue(horizontalPosition - ((viewportWidth - cellWidth) / 2));
        } else {
            if (horizontalPosition - horizontalOffset < 0 || cellWidth > viewportWidth)
                horizontalScrollBar()->setValue(horizontalPosition);
            else if (horizontalPosition - horizontalOffset + cellWidth > viewportWidth)
                horizontalScrollBar()->setValue(horizontalPosition - viewportWidth + cellWidth);
        }
    }

    // Adjust vertical position

    int viewportHeight = d->viewport->height();
    int verticalOffset = d->verticalHeader->offset();
    int verticalPosition = d->verticalHeader->sectionPosition(index.row());
    int verticalIndex = d->verticalHeader->visualIndex(index.row());
    int cellHeight = d->hasSpans()
                     ? d->rowSpanHeight(index.row(), span.height())
                     : d->verticalHeader->sectionSize(index.row());

    if (verticalPosition - verticalOffset < 0 || cellHeight > viewportHeight) {
        if (hint == EnsureVisible)
            hint = PositionAtTop;
    } else if (verticalPosition - verticalOffset + cellHeight > viewportHeight) {
        if (hint == EnsureVisible)
            hint = PositionAtBottom;
    }

    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {

        if (hint == PositionAtBottom || hint == PositionAtCenter) {
            int h = (hint == PositionAtCenter ? viewportHeight / 2 : viewportHeight);
            int y = cellHeight;
            while (verticalIndex > 0) {
                int row = d->verticalHeader->logicalIndex(verticalIndex - 1);
                y += d->verticalHeader->sectionSize(row);
                if (y > h)
                    break;
                --verticalIndex;
            }
        }

        if (hint == PositionAtBottom || hint == PositionAtCenter || hint == PositionAtTop) {
            int hiddenSections = 0;
            if (d->verticalHeader->sectionsHidden()) {
                for (int s = verticalIndex - 1; s >= 0; --s) {
                    int row = d->verticalHeader->logicalIndex(s);
                    if (d->verticalHeader->isSectionHidden(row))
                        ++hiddenSections;
                }
            }
            verticalScrollBar()->setValue(verticalIndex - hiddenSections);
        }

    } else { // ScrollPerPixel
        if (hint == PositionAtTop) {
            verticalScrollBar()->setValue(verticalPosition);
        } else if (hint == PositionAtBottom) {
            verticalScrollBar()->setValue(verticalPosition - viewportHeight + cellHeight);
        } else if (hint == PositionAtCenter) {
            verticalScrollBar()->setValue(verticalPosition - ((viewportHeight - cellHeight) / 2));
        }
    }

    update(index);
}